

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsAttributeLocationTests.cpp
# Opt level: O0

void deqp::gls::anon_unknown_1::bindAttributes
               (TestLog *log,Functions *gl,deUint32 program,
               vector<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
               *binds)

{
  glBindAttribLocationFunc p_Var1;
  bool bVar2;
  deUint32 dVar3;
  GLenum err;
  MessageBuilder *pMVar4;
  pointer pBVar5;
  string *value;
  GLchar *pGVar6;
  deUint32 local_1c8 [4];
  MessageBuilder local_1b8;
  __normal_iterator<const_deqp::gls::AttributeLocationTestUtil::Bind_*,_std::vector<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>_>
  local_38;
  __normal_iterator<const_deqp::gls::AttributeLocationTestUtil::Bind_*,_std::vector<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>_>
  local_30;
  const_iterator iter;
  vector<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
  *binds_local;
  deUint32 program_local;
  Functions *gl_local;
  TestLog *log_local;
  
  iter._M_current = (Bind *)binds;
  local_30._M_current =
       (Bind *)std::
               vector<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
               ::begin(binds);
  while( true ) {
    local_38._M_current =
         (Bind *)std::
                 vector<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
                 ::end(iter._M_current);
    bVar2 = __gnu_cxx::operator!=(&local_30,&local_38);
    if (!bVar2) break;
    tcu::TestLog::operator<<(&local_1b8,log,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar4 = tcu::MessageBuilder::operator<<(&local_1b8,(char (*) [18])"Bind attribute: \'");
    pBVar5 = __gnu_cxx::
             __normal_iterator<const_deqp::gls::AttributeLocationTestUtil::Bind_*,_std::vector<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>_>
             ::operator->(&local_30);
    value = AttributeLocationTestUtil::Bind::getAttributeName_abi_cxx11_(pBVar5);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,value);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [6])0x2bfaa99);
    pBVar5 = __gnu_cxx::
             __normal_iterator<const_deqp::gls::AttributeLocationTestUtil::Bind_*,_std::vector<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>_>
             ::operator->(&local_30);
    local_1c8[0] = AttributeLocationTestUtil::Bind::getLocation(pBVar5);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,local_1c8);
    tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1b8);
    p_Var1 = gl->bindAttribLocation;
    pBVar5 = __gnu_cxx::
             __normal_iterator<const_deqp::gls::AttributeLocationTestUtil::Bind_*,_std::vector<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>_>
             ::operator->(&local_30);
    dVar3 = AttributeLocationTestUtil::Bind::getLocation(pBVar5);
    pBVar5 = __gnu_cxx::
             __normal_iterator<const_deqp::gls::AttributeLocationTestUtil::Bind_*,_std::vector<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>_>
             ::operator->(&local_30);
    AttributeLocationTestUtil::Bind::getAttributeName_abi_cxx11_(pBVar5);
    pGVar6 = (GLchar *)std::__cxx11::string::c_str();
    (*p_Var1)(program,dVar3,pGVar6);
    err = (*gl->getError)();
    glu::checkError(err,"glBindAttribLocation()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsAttributeLocationTests.cpp"
                    ,0x1df);
    __gnu_cxx::
    __normal_iterator<const_deqp::gls::AttributeLocationTestUtil::Bind_*,_std::vector<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>_>
    ::operator++(&local_30);
  }
  return;
}

Assistant:

void bindAttributes (TestLog& log, const glw::Functions& gl, deUint32 program, const vector<Bind>& binds)
{
	for (vector<Bind>::const_iterator iter = binds.begin(); iter != binds.end(); ++iter)
	{
		log << TestLog::Message << "Bind attribute: '" << iter->getAttributeName() << "' to " << iter->getLocation() << TestLog::EndMessage;
		gl.bindAttribLocation(program, iter->getLocation(), iter->getAttributeName().c_str());
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindAttribLocation()");
	}
}